

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

void matd_utriangle_solve(matd_t *u,double *b,double *x)

{
  uint local_3c;
  int j;
  double diag;
  double bi;
  int i;
  double *x_local;
  double *b_local;
  matd_t *u_local;
  
  local_3c = u->ncols;
  while (bi._4_4_ = local_3c - 1, -1 < (int)bi._4_4_) {
    diag = b[(int)bi._4_4_];
    for (; local_3c < u->ncols; local_3c = local_3c + 1) {
      diag = -(double)u[(ulong)(bi._4_4_ * u->ncols + local_3c) + 1] * x[(int)local_3c] + diag;
    }
    x[(int)bi._4_4_] = diag / (double)u[(ulong)(bi._4_4_ * u->ncols + bi._4_4_) + 1];
    local_3c = bi._4_4_;
  }
  return;
}

Assistant:

void matd_utriangle_solve(matd_t *u, const TYPE *b, TYPE *x)
{
    for (int i = u->ncols-1; i >= 0; i--) {
        double bi = b[i];

        double diag = MATD_EL(u, i, i);

        for (int j = i+1; j < u->ncols; j++)
            bi -= MATD_EL(u, i, j)*x[j];

        x[i] = bi / diag;
    }
}